

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O1

bool anon_unknown.dwarf_4a590::cmTarFilesFrom
               (string *file,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *files)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  string line;
  ostringstream e_1;
  ifstream fin;
  string local_3f0;
  string local_3d0;
  undefined1 local_3b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a0 [6];
  ios_base local_340 [264];
  undefined1 local_238 [112];
  ios_base local_1c8 [408];
  
  bVar1 = cmsys::SystemTools::FileIsDirectory(file);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_238,"-E tar --files-from= file \'",0x1b);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_238,(file->_M_dataplus)._M_p,file->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\' is a directory",0x10);
    std::__cxx11::stringbuf::str();
    cmSystemTools::Error((string *)local_3b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0._0_8_ != local_3a0) {
      operator_delete((void *)local_3b0._0_8_,local_3a0[0]._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
    std::ios_base::~ios_base((ios_base *)(local_238 + 0x70));
    bVar1 = false;
  }
  else {
    std::ifstream::ifstream(local_238,(file->_M_dataplus)._M_p,_S_in);
    if (((byte)(*(_func_int **)(local_238._0_8_ + -0x18))[(long)(local_238 + 0x20)] & 5) == 0) {
      local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
      local_3f0._M_string_length = 0;
      local_3f0.field_2._M_local_buf[0] = '\0';
      while( true ) {
        bVar1 = cmsys::SystemTools::GetLineFromStream
                          ((istream *)local_238,&local_3f0,(bool *)0x0,0xffffffffffffffff);
        if (!bVar1) break;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f0._M_string_length !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          local_3b0._0_8_ = local_3f0._M_string_length;
          local_3b0._8_8_ = local_3f0._M_dataplus._M_p;
          __str._M_str = "--add-file=";
          __str._M_len = 0xb;
          iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                            ((basic_string_view<char,_std::char_traits<char>_> *)local_3b0,0,0xb,
                             __str);
          if (iVar2 == 0) {
            std::__cxx11::string::substr((ulong)local_3b0,(ulong)&local_3f0);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)files,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_3b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3b0._0_8_ != local_3a0) {
              operator_delete((void *)local_3b0._0_8_,local_3a0[0]._M_allocated_capacity + 1);
            }
          }
          else {
            local_3b0._0_8_ = local_3f0._M_string_length;
            local_3b0._8_8_ = local_3f0._M_dataplus._M_p;
            __str_00._M_str = "-";
            __str_00._M_len = 1;
            iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                              ((basic_string_view<char,_std::char_traits<char>_> *)local_3b0,0,1,
                               __str_00);
            if (iVar2 == 0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3b0,"-E tar --files-from=\'",0x15);
              poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_3b0,(file->_M_dataplus)._M_p,
                                  file->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar3,"\' file invalid line:\n",0x15);
              poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar3,local_3f0._M_dataplus._M_p,local_3f0._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
              std::__cxx11::stringbuf::str();
              cmSystemTools::Error(&local_3d0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
                operator_delete(local_3d0._M_dataplus._M_p,
                                local_3d0.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
              std::ios_base::~ios_base(local_340);
              break;
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(files,&local_3f0);
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
        operator_delete(local_3f0._M_dataplus._M_p,
                        CONCAT71(local_3f0.field_2._M_allocated_capacity._1_7_,
                                 local_3f0.field_2._M_local_buf[0]) + 1);
      }
      bVar1 = !bVar1;
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_3b0,"-E tar --files-from= file \'",0x1b);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_3b0,(file->_M_dataplus)._M_p,file->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\' not found",0xb);
      std::__cxx11::stringbuf::str();
      cmSystemTools::Error(&local_3f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
        operator_delete(local_3f0._M_dataplus._M_p,
                        CONCAT71(local_3f0.field_2._M_allocated_capacity._1_7_,
                                 local_3f0.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
      std::ios_base::~ios_base(local_340);
      bVar1 = false;
    }
    std::ifstream::~ifstream(local_238);
  }
  return bVar1;
}

Assistant:

bool cmTarFilesFrom(std::string const& file, std::vector<std::string>& files)
{
  if (cmSystemTools::FileIsDirectory(file)) {
    std::ostringstream e;
    e << "-E tar --files-from= file '" << file << "' is a directory";
    cmSystemTools::Error(e.str());
    return false;
  }
  cmsys::ifstream fin(file.c_str());
  if (!fin) {
    std::ostringstream e;
    e << "-E tar --files-from= file '" << file << "' not found";
    cmSystemTools::Error(e.str());
    return false;
  }
  std::string line;
  while (cmSystemTools::GetLineFromStream(fin, line)) {
    if (line.empty()) {
      continue;
    }
    if (cmHasLiteralPrefix(line, "--add-file=")) {
      files.push_back(line.substr(11));
    } else if (cmHasLiteralPrefix(line, "-")) {
      std::ostringstream e;
      e << "-E tar --files-from='" << file << "' file invalid line:\n"
        << line << "\n";
      cmSystemTools::Error(e.str());
      return false;
    } else {
      files.push_back(line);
    }
  }
  return true;
}